

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rlgl.h
# Opt level: O2

void rlTranslatef(float x,float y,float z)

{
  Matrix left;
  Matrix *pMVar1;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined8 local_40;
  undefined8 uStack_38;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  undefined8 uStack_18;
  
  pMVar1 = RLGL.State.currentMatrix;
  left.m14 = z;
  left.m10 = 1.0;
  left.m8 = (float)(int)((ulong)(uint)x << 0x20);
  left.m12 = (float)(int)(((ulong)(uint)x << 0x20) >> 0x20);
  left.m0 = 1.0;
  left.m4 = 0.0;
  left.m1 = 0.0;
  left.m5 = 1.0;
  left.m9 = (float)(int)((ulong)(uint)y << 0x20);
  left.m13 = (float)(int)(((ulong)(uint)y << 0x20) >> 0x20);
  left.m2 = 0.0;
  left.m6 = 0.0;
  left.m3 = 0.0;
  left.m7 = 0.0;
  left.m11 = 0.0;
  left.m15 = 1.0;
  rlMatrixMultiply(left,*RLGL.State.currentMatrix);
  pMVar1->m3 = (float)(undefined4)local_20;
  pMVar1->m7 = (float)local_20._4_4_;
  pMVar1->m11 = (float)(undefined4)uStack_18;
  pMVar1->m15 = (float)uStack_18._4_4_;
  pMVar1->m2 = (float)(undefined4)local_30;
  pMVar1->m6 = (float)local_30._4_4_;
  pMVar1->m10 = (float)(undefined4)uStack_28;
  pMVar1->m14 = (float)uStack_28._4_4_;
  pMVar1->m1 = (float)(undefined4)local_40;
  pMVar1->m5 = (float)local_40._4_4_;
  pMVar1->m9 = (float)(undefined4)uStack_38;
  pMVar1->m13 = (float)uStack_38._4_4_;
  pMVar1->m0 = (float)(undefined4)local_50;
  pMVar1->m4 = (float)local_50._4_4_;
  pMVar1->m8 = (float)(undefined4)uStack_48;
  pMVar1->m12 = (float)uStack_48._4_4_;
  return;
}

Assistant:

void rlTranslatef(float x, float y, float z)
{
    Matrix matTranslation = {
        1.0f, 0.0f, 0.0f, x,
        0.0f, 1.0f, 0.0f, y,
        0.0f, 0.0f, 1.0f, z,
        0.0f, 0.0f, 0.0f, 1.0f
    };

    // NOTE: We transpose matrix with multiplication order
    *RLGL.State.currentMatrix = rlMatrixMultiply(matTranslation, *RLGL.State.currentMatrix);
}